

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode __thiscall JSONNode::duplicate(JSONNode *this)

{
  internalJSONNode *piVar1;
  internalJSONNode *piVar2;
  JSONNode *in_RSI;
  allocator local_99;
  json_string local_98;
  allocator local_71;
  json_string local_70;
  undefined1 local_4d;
  allocator local_39;
  json_string local_38;
  JSONNode *this_local;
  JSONNode *mycopy;
  
  piVar1 = in_RSI->internal;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_4d = 0;
  JSONNode(this,in_RSI);
  piVar1 = in_RSI->internal;
  piVar2 = this->internal;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"copy ctor failed to ref count correctly",&local_71);
  JSONDebug::_JSON_ASSERT(piVar1 == piVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  makeUniqueInternal(this);
  piVar1 = in_RSI->internal;
  piVar2 = this->internal;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"makeUniqueInternal failed",&local_99);
  JSONDebug::_JSON_ASSERT(piVar1 != piVar2,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::duplicate(void) const json_nothrow {
    JSON_CHECK_INTERNAL();
    JSONNode mycopy(*this);
    #ifdef JSON_REF_COUNT
	   JSON_ASSERT(internal == mycopy.internal, JSON_TEXT("copy ctor failed to ref count correctly"));
	   mycopy.makeUniqueInternal();
    #endif
    JSON_ASSERT(internal != mycopy.internal, JSON_TEXT("makeUniqueInternal failed"));
    return mycopy;
}